

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> * __thiscall
vkb::Swapchain::get_image_views
          (Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>
           *__return_storage_ptr__,Swapchain *this,void *pNext)

{
  PFN_vkCreateImageView p_Var1;
  VkDevice pVVar2;
  VkAllocationCallbacks *pVVar3;
  Error error;
  undefined8 uVar4;
  bool bVar5;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *this_00;
  size_type sVar6;
  const_reference ppVVar7;
  reference ppVVar8;
  error_code eVar9;
  error_code error_code;
  error_code local_130;
  VkResult local_120;
  undefined4 uStack_11c;
  VkResult local_114;
  undefined1 local_110 [4];
  VkResult res;
  VkImageViewCreateInfo createInfo;
  size_t i;
  undefined1 local_b0 [8];
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> views;
  VkImageViewUsageCreateInfo desired_flags;
  bool already_contains_image_view_usage;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *swapchain_images;
  undefined1 local_40 [8];
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> swapchain_images_ret;
  void *pNext_local;
  Swapchain *this_local;
  
  swapchain_images_ret._24_8_ = pNext;
  get_images((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)local_40,this);
  bVar5 = vkb::Result::operator_cast_to_bool((Result *)local_40);
  if (bVar5) {
    this_00 = Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::value
                        ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)local_40
                        );
    bVar5 = false;
    for (; swapchain_images_ret._24_8_ != 0;
        swapchain_images_ret._24_8_ = *(undefined8 *)(swapchain_images_ret._24_8_ + 8)) {
      if (*(int *)swapchain_images_ret._24_8_ == 0xf) {
        bVar5 = true;
        break;
      }
    }
    views.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x3b9c930a;
    sVar6 = std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::size(this_00);
    std::allocator<VkImageView_T_*>::allocator((allocator<VkImageView_T_*> *)((long)&i + 7));
    std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::vector
              ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)local_b0,sVar6,
               (allocator<VkImageView_T_*> *)((long)&i + 7));
    std::allocator<VkImageView_T_*>::~allocator((allocator<VkImageView_T_*> *)((long)&i + 7));
    createInfo.subresourceRange.layerCount = 0;
    createInfo._76_4_ = 0;
    while( true ) {
      uVar4 = createInfo._72_8_;
      sVar6 = std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::size(this_00);
      if (sVar6 <= (ulong)uVar4) break;
      memset(local_110,0,0x50);
      local_110 = (undefined1  [4])0xf;
      if ((this->instance_version < 0x401000) || (bVar5)) {
        createInfo._0_8_ = swapchain_images_ret._24_8_;
      }
      else {
        createInfo._0_8_ =
             &views.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      }
      ppVVar7 = std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::operator[]
                          (this_00,createInfo._72_8_);
      createInfo._16_8_ = *ppVVar7;
      createInfo.image._0_4_ = 1;
      createInfo.image._4_4_ = this->image_format;
      createInfo.viewType = VK_IMAGE_VIEW_TYPE_1D;
      createInfo.format = VK_FORMAT_UNDEFINED;
      createInfo.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
      createInfo.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
      createInfo.components.b = VK_COMPONENT_SWIZZLE_ZERO;
      createInfo.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
      createInfo.subresourceRange.aspectMask = 1;
      createInfo.subresourceRange.baseMipLevel = 0;
      createInfo.subresourceRange.levelCount = 1;
      p_Var1 = (this->internal_table).fp_vkCreateImageView;
      pVVar2 = this->device;
      pVVar3 = this->allocation_callbacks;
      ppVVar8 = std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::operator[]
                          ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)local_b0,
                           createInfo._72_8_);
      local_114 = (*p_Var1)(pVVar2,(VkImageViewCreateInfo *)local_110,pVVar3,ppVVar8);
      if (local_114 != VK_SUCCESS) {
        std::error_code::error_code<vkb::SwapchainError,void>
                  (&local_130,failed_create_swapchain_image_views);
        local_120 = local_114;
        error._20_4_ = uStack_11c;
        error.vk_result = local_114;
        error.type._M_cat = local_130._M_cat;
        error.type._M_value = local_130._M_value;
        error.type._4_4_ = local_130._4_4_;
        Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>::Result
                  (__return_storage_ptr__,error);
        goto LAB_00132656;
      }
      createInfo._72_8_ = createInfo._72_8_ + 1;
    }
    Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>::Result
              (__return_storage_ptr__,
               (vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)local_b0);
LAB_00132656:
    std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::~vector
              ((vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> *)local_b0);
  }
  else {
    eVar9 = Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::error
                      ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)local_40);
    error_code._M_cat = eVar9._M_cat;
    error_code._4_4_ = 0;
    error_code._M_value = eVar9._M_value;
    Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>::Result
              (__return_storage_ptr__,error_code,VK_SUCCESS);
  }
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::~Result
            ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<VkImageView>> Swapchain::get_image_views(const void* pNext) {
    const auto swapchain_images_ret = get_images();
    if (!swapchain_images_ret) return swapchain_images_ret.error();
    const auto& swapchain_images = swapchain_images_ret.value();

    bool already_contains_image_view_usage = false;
    while (pNext) {
        if (reinterpret_cast<const VkBaseInStructure*>(pNext)->sType == VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO) {
            already_contains_image_view_usage = true;
            break;
        }
        pNext = reinterpret_cast<const VkBaseInStructure*>(pNext)->pNext;
    }
    VkImageViewUsageCreateInfo desired_flags{};
    desired_flags.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_USAGE_CREATE_INFO;
    desired_flags.pNext = pNext;
    desired_flags.usage = image_usage_flags;

    std::vector<VkImageView> views(swapchain_images.size());
    for (size_t i = 0; i < swapchain_images.size(); i++) {
        VkImageViewCreateInfo createInfo = {};
        createInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
        if (instance_version >= VKB_VK_API_VERSION_1_1 && !already_contains_image_view_usage) {
            createInfo.pNext = &desired_flags;
        } else {
            createInfo.pNext = pNext;
        }

        createInfo.image = swapchain_images[i];
        createInfo.viewType = VK_IMAGE_VIEW_TYPE_2D;
        createInfo.format = image_format;
        createInfo.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.components.b = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        createInfo.subresourceRange.baseMipLevel = 0;
        createInfo.subresourceRange.levelCount = 1;
        createInfo.subresourceRange.baseArrayLayer = 0;
        createInfo.subresourceRange.layerCount = 1;
        VkResult res = internal_table.fp_vkCreateImageView(device, &createInfo, allocation_callbacks, &views[i]);
        if (res != VK_SUCCESS) return Error{ SwapchainError::failed_create_swapchain_image_views, res };
    }
    return views;
}